

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::setMinimumDate(QDateTimeEdit *this,QDate min)

{
  long lVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  QDate local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (min.jd + 0xb69eeff91fU < 0x16d3e147974) {
    lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    QDate::QDate(&local_30,100,1,1);
    if (local_30.jd <= min.jd) {
      uVar2 = ::QVariant::toTime();
      QDateTime::QDateTime((QDateTime *)&local_30,min.jd,uVar2,lVar1 + 0x508,1);
      setMinimumDateTime(this,(QDateTime *)&local_30);
      QDateTime::~QDateTime((QDateTime *)&local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setMinimumDate(QDate min)
{
    Q_D(QDateTimeEdit);
    if (min.isValid() && min >= QDATETIMEEDIT_DATE_MIN)
        setMinimumDateTime(d->dateTimeValue(min, d->minimum.toTime()));
}